

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_4,_4> *
gl4cts::Math::inverse<4>(Matrix<double,_4,_4> *__return_storage_ptr__,Matrix<double,_4,_4> *matrix)

{
  undefined8 uVar1;
  undefined8 uVar2;
  GLuint c;
  double *pdVar3;
  ulong uVar4;
  Matrix<double,_4,_4> *pMVar5;
  long lVar6;
  int row;
  long lVar7;
  long lVar8;
  ulong uVar9;
  Matrix<double,_4,_4> *pMVar10;
  Vector<double,_4> *pVVar11;
  GLuint c_1;
  ulong uVar12;
  int row_1;
  GLuint r_1;
  ulong uVar13;
  undefined8 uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  bool bVar18;
  Matrix<double,_4,_4> adjugate;
  Matrix<double,_4,_4> cof;
  double adStack_138 [4];
  Matrix<double,_4,_4> local_118;
  double local_98 [16];
  long lVar17;
  
  pMVar5 = &local_118;
  pdVar3 = local_98;
  local_98[0xe] = 0.0;
  local_98[0xf] = 0.0;
  local_98[0xc] = 0.0;
  local_98[0xd] = 0.0;
  local_98[10] = 0.0;
  local_98[0xb] = 0.0;
  local_98[8] = 0.0;
  local_98[9] = 0.0;
  local_98[6] = 0.0;
  local_98[7] = 0.0;
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar14 = 0x3ff0000000000000;
      if (lVar6 != lVar8) {
        uVar14 = 0;
      }
      *(undefined8 *)((long)pdVar3 + lVar8) = uVar14;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x80);
    lVar7 = lVar7 + 1;
    pdVar3 = pdVar3 + 1;
    lVar6 = lVar6 + 0x20;
  } while (lVar7 != 4);
  uVar4 = 0;
  do {
    uVar9 = 0;
    do {
      local_118.m_data.m_data[1].m_data[2] = 0.0;
      local_118.m_data.m_data[1].m_data[3] = 0.0;
      local_118.m_data.m_data[1].m_data[0] = 0.0;
      local_118.m_data.m_data[1].m_data[1] = 0.0;
      local_118.m_data.m_data[0].m_data[2] = 0.0;
      local_118.m_data.m_data[0].m_data[3] = 0.0;
      local_118.m_data.m_data[0].m_data[0] = 0.0;
      local_118.m_data.m_data[0].m_data[1] = 0.0;
      local_118.m_data.m_data[2].m_data[0] = 0.0;
      lVar6 = 0;
      lVar7 = 0;
      pMVar10 = &local_118;
      do {
        lVar8 = 0;
        auVar16 = _DAT_019f34d0;
        do {
          bVar18 = SUB164(auVar16 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                   SUB164(auVar16 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
          if (bVar18) {
            uVar14 = 0x3ff0000000000000;
            if (lVar6 != lVar8) {
              uVar14 = 0;
            }
            *(undefined8 *)((long)pMVar10 + lVar8) = uVar14;
          }
          if (bVar18) {
            uVar14 = 0x3ff0000000000000;
            if (lVar6 + -0x18 != lVar8) {
              uVar14 = 0;
            }
            *(undefined8 *)((long)pMVar10 + lVar8 + 0x18) = uVar14;
          }
          lVar17 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 2;
          auVar16._8_8_ = lVar17 + 2;
          lVar8 = lVar8 + 0x30;
        } while (lVar8 != 0x60);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x18;
        pMVar10 = (Matrix<double,_4,_4> *)((long)pMVar10 + 8);
      } while (lVar7 != 3);
      uVar12 = 0;
      pVVar11 = (Vector<double,_4> *)matrix;
      do {
        if (uVar12 != uVar4) {
          uVar13 = 0;
          do {
            if (uVar9 != uVar13) {
              local_118.m_data.m_data[0].m_data
              [(long)(int)((int)uVar12 - (uint)(uVar4 < uVar12)) * 3 +
               (long)(int)((int)uVar13 - (uint)(uVar9 < uVar13))] =
                   ((Vector<tcu::Vector<double,_4>,_4> *)pVVar11->m_data)->m_data[0].m_data[uVar13];
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != 4);
        }
        uVar12 = uVar12 + 1;
        pVVar11 = pVVar11 + 1;
      } while (uVar12 != 4);
      dVar15 = (local_118.m_data.m_data[0].m_data[1] * local_118.m_data.m_data[1].m_data[1] -
               local_118.m_data.m_data[1].m_data[0] * local_118.m_data.m_data[0].m_data[2]) *
               local_118.m_data.m_data[1].m_data[2] +
               ((local_118.m_data.m_data[1].m_data[0] * local_118.m_data.m_data[2].m_data[0] -
                local_118.m_data.m_data[1].m_data[3] * local_118.m_data.m_data[1].m_data[1]) *
                local_118.m_data.m_data[0].m_data[0] -
               (local_118.m_data.m_data[2].m_data[0] * local_118.m_data.m_data[0].m_data[1] -
               local_118.m_data.m_data[1].m_data[3] * local_118.m_data.m_data[0].m_data[2]) *
               local_118.m_data.m_data[0].m_data[3]);
      if (((int)uVar9 + (int)uVar4 & 1U) != 0) {
        dVar15 = -dVar15;
      }
      local_98[uVar4 * 4 + uVar9] = dVar15;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 4);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 4);
  local_118.m_data.m_data[3].m_data[2] = 0.0;
  local_118.m_data.m_data[3].m_data[3] = 0.0;
  local_118.m_data.m_data[3].m_data[0] = 0.0;
  local_118.m_data.m_data[3].m_data[1] = 0.0;
  local_118.m_data.m_data[2].m_data[2] = 0.0;
  local_118.m_data.m_data[2].m_data[3] = 0.0;
  local_118.m_data.m_data[2].m_data[0] = 0.0;
  local_118.m_data.m_data[2].m_data[1] = 0.0;
  local_118.m_data.m_data[1].m_data[2] = 0.0;
  local_118.m_data.m_data[1].m_data[3] = 0.0;
  local_118.m_data.m_data[1].m_data[0] = 0.0;
  local_118.m_data.m_data[1].m_data[1] = 0.0;
  local_118.m_data.m_data[0].m_data[2] = 0.0;
  local_118.m_data.m_data[0].m_data[3] = 0.0;
  local_118.m_data.m_data[0].m_data[0] = 0.0;
  local_118.m_data.m_data[0].m_data[1] = 0.0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar14 = 0x3ff0000000000000;
      if (lVar6 != lVar8) {
        uVar14 = 0;
      }
      *(undefined8 *)((long)pMVar5 + lVar8) = uVar14;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x80);
    lVar7 = lVar7 + 1;
    pMVar5 = (Matrix<double,_4,_4> *)((long)pMVar5 + 8);
    lVar6 = lVar6 + 0x20;
  } while (lVar7 != 4);
  lVar6 = 0;
  do {
    uVar14 = *(undefined8 *)((long)local_98 + lVar6 + 0x40);
    uVar1 = *(undefined8 *)((long)local_98 + lVar6 + 0x20);
    uVar2 = *(undefined8 *)((long)local_98 + lVar6 + 0x60);
    *(undefined8 *)((long)local_118.m_data.m_data[0].m_data + lVar6 * 4) =
         *(undefined8 *)((long)local_98 + lVar6);
    *(undefined8 *)((long)local_118.m_data.m_data[0].m_data + lVar6 * 4 + 8) = uVar1;
    *(undefined8 *)((long)local_118.m_data.m_data[0].m_data + lVar6 * 4 + 0x10) = uVar14;
    *(undefined8 *)((long)local_118.m_data.m_data[0].m_data + lVar6 * 4 + 0x18) = uVar2;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  dVar15 = determinant<double>(matrix);
  tcu::operator*(__return_storage_ptr__,&local_118,1.0 / dVar15);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}